

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall create::Create::driveRadius(Create *this,float *vel,float *radius)

{
  short sVar1;
  ssize_t sVar2;
  uint uVar3;
  short sVar4;
  int in_R8D;
  float fVar5;
  float fVar6;
  uint8_t cmd [5];
  size_t __n;
  
  fVar6 = *vel;
  fVar5 = RobotModel::getMaxVelocity(&this->model);
  if (-fVar5 <= fVar6) {
    fVar6 = *vel;
    fVar5 = RobotModel::getMaxVelocity(&this->model);
    if (fVar6 <= fVar5) {
      fVar6 = *vel;
    }
    else {
      fVar6 = RobotModel::getMaxVelocity(&this->model);
    }
  }
  else {
    fVar6 = RobotModel::getMaxVelocity(&this->model);
    fVar6 = -fVar6;
  }
  fVar5 = roundf(*radius * 1000.0);
  uVar3 = (int)fVar5 & 0xffff;
  __n = (size_t)uVar3;
  sVar1 = (short)(int)fVar5;
  sVar4 = sVar1;
  if ((((1 < uVar3 - 0x7fff) && (uVar3 != 1)) && (uVar3 != 0xffff)) &&
     (sVar4 = -2000, -0x7d1 < sVar1)) {
    fVar5 = 2000.0;
    if ((float)(int)sVar1 <= 2000.0) {
      fVar5 = (float)(int)sVar1;
    }
    sVar4 = (short)(int)fVar5;
  }
  fVar6 = roundf(fVar6 * 1000.0);
  cmd[0] = 0x89;
  cmd[1] = (uint8_t)((uint)(int)fVar6 >> 8);
  cmd[2] = (uint8_t)(int)fVar6;
  cmd[3] = (uint8_t)((ushort)sVar4 >> 8);
  cmd[4] = (uint8_t)sVar4;
  sVar2 = Serial::send((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(int)cmd,(void *)0x5,__n,in_R8D);
  return SUB81(sVar2,0);
}

Assistant:

bool Create::driveRadius(const float& vel, const float& radius) {
    // Bound velocity
    float boundedVel = BOUND_CONST(vel, -model.getMaxVelocity(), model.getMaxVelocity());

    // Expects each parameter as two bytes each and in millimeters
    int16_t vel_mm = roundf(boundedVel * 1000);
    int16_t radius_mm = roundf(radius * 1000);

    // Bound radius if not a special case
    if (radius_mm != -32768 && radius_mm != 32767 &&
        radius_mm != -1 && radius_mm != 1) {
      BOUND(radius_mm, -util::MAX_RADIUS * 1000, util::MAX_RADIUS * 1000);
    }

    uint8_t cmd[5] = { OC_DRIVE,
                       static_cast<uint8_t>(vel_mm >> 8),
                       static_cast<uint8_t>(vel_mm & 0xff),
                       static_cast<uint8_t>(radius_mm >> 8),
                       static_cast<uint8_t>(radius_mm & 0xff)
                     };

    return serial->send(cmd, 5);
  }